

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O2

textblock * object_info_ego(ego_item *ego)

{
  textblock *ptVar1;
  ulong uVar2;
  object_kind *poVar3;
  object obj;
  object known_obj;
  
  memcpy(&obj,&DAT_0021e330,0x148);
  memcpy(&known_obj,&DAT_0021e330,0x148);
  obj.kind = (object_kind *)0x0;
  poVar3 = k_info;
  for (uVar2 = 0;
      (z_info->k_max != uVar2 &&
      ((obj.kind = poVar3, poVar3->name == (char *)0x0 || (uVar2 != ego->poss_items->kidx))));
      uVar2 = uVar2 + 1) {
    poVar3 = poVar3 + 1;
  }
  obj.tval = (uint8_t)(obj.kind)->tval;
  obj.sval = (uint8_t)(obj.kind)->sval;
  obj.ego = ego;
  ego_apply_magic(&obj,L'\0',MINIMISE);
  object_copy(&known_obj,&obj);
  obj.known = &known_obj;
  ptVar1 = object_info_out(&obj,L'\x04');
  object_wipe(&known_obj);
  object_wipe(&obj);
  return ptVar1;
}

Assistant:

textblock *object_info_ego(struct ego_item *ego)
{
	struct object_kind *kind = NULL;
	struct object obj = OBJECT_NULL, known_obj = OBJECT_NULL;
	size_t i;
	textblock *result;

	for (i = 0; i < z_info->k_max; i++) {
		kind = &k_info[i];
		if (!kind->name)
			continue;
		if (i == ego->poss_items->kidx)
			break;
	}

	obj.kind = kind;
	obj.tval = kind->tval;
	obj.sval = kind->sval;
	obj.ego = ego;
	ego_apply_magic(&obj, 0, MINIMISE);

	object_copy(&known_obj, &obj);
	obj.known = &known_obj;

	result = object_info_out(&obj, OINFO_NONE | OINFO_EGO);
	object_wipe(&known_obj);
	object_wipe(&obj);
	return result;
}